

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt32 * tt_cmap14_get_nondef_chars(TT_CMap cmap,FT_Byte *p,FT_Memory memory)

{
  FT_Error FVar1;
  FT_CMap_Class pFVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  uint uVar6;
  
  uVar6 = *(uint *)p;
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  FVar1 = tt_cmap14_ensure((TT_CMap14)cmap,uVar6 + 1,memory);
  if (FVar1 == 0) {
    pFVar2 = cmap[1].cmap.clazz;
    if (uVar6 == 0) {
      uVar3 = 0;
    }
    else {
      pbVar5 = p + 4;
      uVar3 = (ulong)uVar6;
      uVar4 = 0;
      do {
        *(uint *)((long)&pFVar2->size + uVar4 * 4) =
             (uint)pbVar5[2] | (uint)pbVar5[1] << 8 | (uint)*pbVar5 << 0x10;
        pbVar5 = pbVar5 + 5;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    *(FT_UInt32 *)((long)&pFVar2->size + uVar3 * 4) = 0;
  }
  else {
    pFVar2 = (FT_CMap_Class)0x0;
  }
  return (FT_UInt32 *)pFVar2;
}

Assistant:

static FT_UInt32*
  tt_cmap14_get_nondef_chars( TT_CMap     cmap,
                              FT_Byte    *p,
                              FT_Memory   memory )
  {
    TT_CMap14   cmap14 = (TT_CMap14) cmap;
    FT_UInt32   numMappings;
    FT_UInt     i;
    FT_UInt32  *ret;


    numMappings = (FT_UInt32)TT_NEXT_ULONG( p );

    if ( tt_cmap14_ensure( cmap14, ( numMappings + 1 ), memory ) )
      return NULL;

    ret = cmap14->results;
    for ( i = 0; i < numMappings; i++ )
    {
      ret[i] = (FT_UInt32)TT_NEXT_UINT24( p );
      p += 2;
    }
    ret[i] = 0;

    return ret;
  }